

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(index_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  int extraout_EAX;
  undefined7 extraout_var;
  size_t sVar3;
  path_node_type *ppVar4;
  long lVar5;
  long extraout_RAX;
  undefined4 in_register_00000034;
  reference root;
  size_t i_1;
  int64_t index;
  size_t i;
  int64_t slen;
  result_options in_stack_ffffffffffffff74;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  path_node_type *in_stack_ffffffffffffff80;
  path_node_type *in_stack_ffffffffffffff88;
  reference in_stack_ffffffffffffff90;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff98;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffa0;
  result_options in_stack_ffffffffffffffb0;
  result_options options;
  reference pbVar6;
  index_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_00;
  int iVar2;
  
  root = (reference)CONCAT44(in_register_00000034,__nfds);
  this_00 = this;
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff88);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    sVar3 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffff78);
    if ((this->index_ < 0) || ((long)sVar3 <= this->index_)) {
      lVar5 = sVar3 + this->index_;
      if ((-1 < lVar5) && (lVar5 < (long)sVar3)) {
        pbVar6 = root;
        ppVar4 = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate((eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                             *)in_stack_ffffffffffffff88,(path_node_type *)__readfds,(size_t)root,
                            in_stack_ffffffffffffff74);
        options = (result_options)lVar5;
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00,
                   (size_t)pbVar6);
        base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::tail_select(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      ppVar4,(reference)__readfds,(node_receiver_type *)root,options);
        lVar5 = extraout_RAX;
      }
      iVar2 = (int)lVar5;
    }
    else {
      pbVar6 = root;
      ppVar4 = path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::generate((eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                           *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          (size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this_00,
                 (size_t)pbVar6);
      base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::tail_select((base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)ppVar4,
                    (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)__readfds,root,in_stack_ffffffffffffff88,(reference)in_stack_ffffffffffffff80
                    ,(node_receiver_type *)in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0);
      iVar2 = extraout_EAX;
    }
  }
  return iVar2;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), receiver, options);
                }
                else 
                {
                    int64_t index = slen + index_;
                    if (index >= 0 && index < slen)
                    {
                        auto i = static_cast<std::size_t>(index);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current.at(i), receiver, options);
                    }
                }
            }
        }